

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O2

void multikey_multipivot<unsigned_char,16u>(uchar **strings,size_t n,size_t depth)

{
  byte *pbVar1;
  uchar *puVar2;
  size_t n_00;
  size_t n_01;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined7 uVar35;
  uchar uVar36;
  byte bVar37;
  void *__src;
  byte bVar38;
  uint i_1;
  ulong uVar39;
  ulong uVar40;
  size_t sVar41;
  ulong uVar42;
  unsigned_long uVar43;
  uint j;
  long lVar44;
  unsigned_long *__memptr;
  byte *pbVar45;
  long lVar46;
  byte *__ptr;
  size_t i_2;
  byte *pbVar47;
  int iVar48;
  uchar **ppuVar49;
  uint j_2;
  byte bVar50;
  double dVar51;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  undefined1 auVar52 [16];
  byte bVar67;
  byte bVar68;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  double dVar69;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  undefined8 uStack_1c0;
  array<unsigned_char,_16UL> pivots;
  byte bStack_1a7;
  byte bStack_1a6;
  byte bStack_1a5;
  byte bStack_1a4;
  byte bStack_1a3;
  byte bStack_1a2;
  byte bStack_1a1;
  byte bStack_1a0;
  byte bStack_19f;
  byte bStack_19e;
  byte bStack_19d;
  byte bStack_19c;
  byte bStack_19b;
  byte bStack_19a;
  byte bStack_199;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_array;
  undefined8 local_178;
  byte bStack_170;
  byte bStack_16f;
  byte bStack_16e;
  byte bStack_16d;
  byte bStack_16c;
  byte bStack_16b;
  byte bStack_16a;
  byte bStack_169;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> sample;
  array<unsigned_long,_33UL> bucketsize;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sample._M_t._M_impl.super__Rb_tree_header._M_header;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sample._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar44 = n - 7;
  auVar52._8_4_ = (int)((ulong)lVar44 >> 0x20);
  auVar52._0_8_ = lVar44;
  auVar52._12_4_ = 0x45300000;
  uStack_1c0 = auVar52._8_8_ - 1.9342813113834067e+25;
  dVar69 = uStack_1c0 + ((double)CONCAT44(0x43300000,(int)lVar44) - 4503599627370496.0);
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (iVar48 = 0; iVar48 != 0x10; iVar48 = iVar48 + 1) {
    dVar51 = drand48();
    dVar51 = dVar51 * dVar69;
    uVar39 = (ulong)dVar51;
    uVar39 = (long)(dVar51 - 9.223372036854776e+18) & (long)uVar39 >> 0x3f | uVar39;
    if (n <= uVar39 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                   );
    }
    for (lVar44 = 0; lVar44 != 7; lVar44 = lVar44 + 1) {
      uVar36 = get_char<unsigned_char>(strings[uVar39 + lVar44],depth);
      *(uchar *)((long)bucketsize._M_elems + lVar44) = uVar36;
    }
    std::
    _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
    ::_M_insert_range_unique<unsigned_char*>
              ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                *)&sample,(uchar *)&bucketsize,(uchar *)((long)bucketsize._M_elems + 7));
  }
  bucketsize._M_elems[0]._0_1_ = 1;
  while (sample._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x10) {
    if ((byte)bucketsize._M_elems[0] == 0) {
      bucketsize._M_elems[0]._0_1_ = 1;
    }
    std::
    _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
    ::_M_insert_unique<unsigned_char_const&>
              ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                *)&sample,(uchar *)&bucketsize);
    bucketsize._M_elems[0]._0_1_ = (byte)bucketsize._M_elems[0] + 1;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::_Rb_tree_const_iterator<unsigned_char>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sample_array,
             (_Rb_tree_const_iterator<unsigned_char>)
             sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_char>)&sample._M_t._M_impl.super__Rb_tree_header,
             (allocator_type *)&bucketsize);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::clear(&sample._M_t);
  uVar39 = (ulong)((long)sample_array.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)sample_array.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar39 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                 );
  }
  uVar42 = 0;
  for (lVar44 = 0; lVar44 != 0x10; lVar44 = lVar44 + 1) {
    pivots._M_elems[lVar44] =
         sample_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar42 & 0xffffffff];
    uVar42 = uVar42 + uVar39;
  }
  __memptr = bucketsize._M_elems;
  iVar48 = posix_memalign((void **)__memptr,0x10,n);
  __ptr = (byte *)CONCAT71(bucketsize._M_elems[0]._1_7_,(byte)bucketsize._M_elems[0]);
  for (lVar44 = 0; uVar35 = bucketsize._M_elems[0]._1_7_, bVar37 = (byte)bucketsize._M_elems[0],
      lVar44 != 0x10; lVar44 = lVar44 + 1) {
    uVar36 = pivots._M_elems[lVar44];
    for (lVar46 = 0; lVar46 != 0x10; lVar46 = lVar46 + 1) {
      *(uchar *)((long)__memptr + lVar46) = uVar36 + 0x80;
    }
    __memptr = __memptr + 2;
  }
  pbVar47 = (byte *)0x0;
  if (iVar48 != 0) {
    __ptr = pbVar47;
  }
  pbVar45 = (byte *)(n & 0xfffffffffffffff0);
  ppuVar49 = strings;
  for (; pbVar47 < pbVar45; pbVar47 = pbVar47 + 0x10) {
    for (lVar44 = 0; lVar44 != 0x10; lVar44 = lVar44 + 1) {
      uVar36 = get_char<unsigned_char>(ppuVar49[lVar44],depth);
      *(uchar *)((long)&local_178 + lVar44) = uVar36;
    }
    bVar68 = (byte)local_178 ^ 0x80;
    bVar70 = local_178._1_1_ ^ 0x80;
    bVar71 = local_178._2_1_ ^ 0x80;
    bVar72 = local_178._3_1_ ^ 0x80;
    bVar73 = local_178._4_1_ ^ 0x80;
    bVar74 = local_178._5_1_ ^ 0x80;
    bVar75 = local_178._6_1_ ^ 0x80;
    bVar76 = local_178._7_1_ ^ 0x80;
    bVar77 = bStack_170 ^ 0x80;
    bVar78 = bStack_16f ^ 0x80;
    bVar79 = bStack_16e ^ 0x80;
    bVar80 = bStack_16d ^ 0x80;
    bVar81 = bStack_16c ^ 0x80;
    bVar82 = bStack_16b ^ 0x80;
    bVar83 = bStack_16a ^ 0x80;
    bVar84 = bStack_169 ^ 0x80;
    bVar86 = 0;
    bVar88 = 0;
    bVar90 = 0;
    bVar92 = 0;
    bVar94 = 0;
    bVar96 = 0;
    bVar98 = 0;
    bVar100 = 0;
    bVar102 = 0;
    bVar104 = 0;
    bVar106 = 0;
    bVar108 = 0;
    bVar110 = 0;
    bVar112 = 0;
    bVar114 = 0;
    bVar116 = 0;
    lVar44 = 0x10;
    bStack_1a7 = (byte)uVar35;
    bStack_1a6 = (byte)((uint7)uVar35 >> 8);
    bStack_1a5 = (byte)((uint7)uVar35 >> 0x10);
    bStack_1a4 = (byte)((uint7)uVar35 >> 0x18);
    bStack_1a3 = (byte)((uint7)uVar35 >> 0x20);
    bStack_1a2 = (byte)((uint7)uVar35 >> 0x28);
    bStack_1a1 = (byte)((uint7)uVar35 >> 0x30);
    bStack_1a0 = (byte)bucketsize._M_elems[1];
    bStack_19f = (byte)(bucketsize._M_elems[1] >> 8);
    bStack_19e = (byte)(bucketsize._M_elems[1] >> 0x10);
    bStack_19d = (byte)(bucketsize._M_elems[1] >> 0x18);
    bStack_19c = (byte)(bucketsize._M_elems[1] >> 0x20);
    bStack_19b = (byte)(bucketsize._M_elems[1] >> 0x28);
    bStack_19a = (byte)(bucketsize._M_elems[1] >> 0x30);
    bStack_199 = (byte)(bucketsize._M_elems[1] >> 0x38);
    bVar50 = 1;
    bVar53 = 1;
    bVar54 = 1;
    bVar55 = 1;
    bVar56 = 1;
    bVar57 = 1;
    bVar58 = 1;
    bVar59 = 1;
    bVar60 = 1;
    bVar61 = 1;
    bVar62 = 1;
    bVar63 = 1;
    bVar64 = 1;
    bVar65 = 1;
    bVar66 = 1;
    bVar67 = 1;
    bVar38 = bVar37;
    while( true ) {
      bVar3 = bVar68 == bVar38;
      bVar4 = bVar70 == bStack_1a7;
      bVar5 = bVar71 == bStack_1a6;
      bVar6 = bVar72 == bStack_1a5;
      bVar7 = bVar73 == bStack_1a4;
      bVar8 = bVar74 == bStack_1a3;
      bVar9 = bVar75 == bStack_1a2;
      bVar10 = bVar76 == bStack_1a1;
      bVar11 = bVar77 == bStack_1a0;
      bVar12 = bVar78 == bStack_19f;
      bVar13 = bVar79 == bStack_19e;
      bVar14 = bVar80 == bStack_19d;
      bVar15 = bVar81 == bStack_19c;
      bVar16 = bVar82 == bStack_19b;
      bVar17 = bVar83 == bStack_19a;
      bVar18 = bVar84 == bStack_199;
      bVar117 = bVar50 + 1;
      bVar118 = bVar53 + 1;
      bVar119 = bVar54 + 1;
      bVar120 = bVar55 + 1;
      bVar121 = bVar56 + 1;
      bVar122 = bVar57 + 1;
      bVar123 = bVar58 + 1;
      bVar124 = bVar59 + 1;
      bVar125 = bVar60 + 1;
      bVar126 = bVar61 + 1;
      bVar127 = bVar62 + 1;
      bVar128 = bVar63 + 1;
      bVar129 = bVar64 + 1;
      bVar130 = bVar65 + 1;
      bVar131 = bVar66 + 1;
      bVar132 = bVar67 + 1;
      bVar19 = (char)bVar38 < (char)bVar68;
      bVar20 = (char)bStack_1a7 < (char)bVar70;
      bVar21 = (char)bStack_1a6 < (char)bVar71;
      bVar22 = (char)bStack_1a5 < (char)bVar72;
      bVar23 = (char)bStack_1a4 < (char)bVar73;
      bVar24 = (char)bStack_1a3 < (char)bVar74;
      bVar25 = (char)bStack_1a2 < (char)bVar75;
      bVar26 = (char)bStack_1a1 < (char)bVar76;
      bVar27 = (char)bStack_1a0 < (char)bVar77;
      bVar28 = (char)bStack_19f < (char)bVar78;
      bVar29 = (char)bStack_19e < (char)bVar79;
      bVar30 = (char)bStack_19d < (char)bVar80;
      bVar31 = (char)bStack_19c < (char)bVar81;
      bVar32 = (char)bStack_19b < (char)bVar82;
      bVar33 = (char)bStack_19a < (char)bVar83;
      bVar34 = (char)bStack_199 < (char)bVar84;
      if (lVar44 == 0x100) break;
      bVar38 = *(byte *)((long)bucketsize._M_elems + lVar44);
      bStack_1a7 = *(byte *)((long)bucketsize._M_elems + lVar44 + 1);
      bStack_1a6 = *(byte *)((long)bucketsize._M_elems + lVar44 + 2);
      bStack_1a5 = *(byte *)((long)bucketsize._M_elems + lVar44 + 3);
      bStack_1a4 = *(byte *)((long)bucketsize._M_elems + lVar44 + 4);
      bStack_1a3 = *(byte *)((long)bucketsize._M_elems + lVar44 + 5);
      bStack_1a2 = *(byte *)((long)bucketsize._M_elems + lVar44 + 6);
      bStack_1a1 = *(byte *)((long)bucketsize._M_elems + lVar44 + 7);
      bStack_1a0 = *(byte *)((long)bucketsize._M_elems + lVar44 + 8);
      bStack_19f = *(byte *)((long)bucketsize._M_elems + lVar44 + 9);
      bStack_19e = *(byte *)((long)bucketsize._M_elems + lVar44 + 10);
      bStack_19d = *(byte *)((long)bucketsize._M_elems + lVar44 + 0xb);
      bStack_19c = *(byte *)((long)bucketsize._M_elems + lVar44 + 0xc);
      bStack_19b = *(byte *)((long)bucketsize._M_elems + lVar44 + 0xd);
      bStack_19a = *(byte *)((long)bucketsize._M_elems + lVar44 + 0xe);
      bStack_199 = *(byte *)((long)bucketsize._M_elems + lVar44 + 0xf);
      bVar85 = -bVar3 & bVar50;
      bVar87 = -bVar4 & bVar53;
      bVar89 = -bVar5 & bVar54;
      bVar91 = -bVar6 & bVar55;
      bVar93 = -bVar7 & bVar56;
      bVar95 = -bVar8 & bVar57;
      bVar97 = -bVar9 & bVar58;
      bVar99 = -bVar10 & bVar59;
      bVar101 = -bVar11 & bVar60;
      bVar103 = -bVar12 & bVar61;
      bVar105 = -bVar13 & bVar62;
      bVar107 = -bVar14 & bVar63;
      bVar109 = -bVar15 & bVar64;
      bVar111 = -bVar16 & bVar65;
      bVar113 = -bVar17 & bVar66;
      bVar115 = -bVar18 & bVar67;
      bVar50 = bVar50 + 2;
      bVar53 = bVar53 + 2;
      bVar54 = bVar54 + 2;
      bVar55 = bVar55 + 2;
      bVar56 = bVar56 + 2;
      bVar57 = bVar57 + 2;
      bVar58 = bVar58 + 2;
      bVar59 = bVar59 + 2;
      bVar60 = bVar60 + 2;
      bVar61 = bVar61 + 2;
      bVar62 = bVar62 + 2;
      bVar63 = bVar63 + 2;
      bVar64 = bVar64 + 2;
      bVar65 = bVar65 + 2;
      bVar66 = bVar66 + 2;
      bVar67 = bVar67 + 2;
      bVar86 = bVar85 | bVar86 | -bVar19 & bVar117 & -((char)bVar68 < (char)bVar38);
      bVar88 = bVar87 | bVar88 | -bVar20 & bVar118 & -((char)bVar70 < (char)bStack_1a7);
      bVar90 = bVar89 | bVar90 | -bVar21 & bVar119 & -((char)bVar71 < (char)bStack_1a6);
      bVar92 = bVar91 | bVar92 | -bVar22 & bVar120 & -((char)bVar72 < (char)bStack_1a5);
      bVar94 = bVar93 | bVar94 | -bVar23 & bVar121 & -((char)bVar73 < (char)bStack_1a4);
      bVar96 = bVar95 | bVar96 | -bVar24 & bVar122 & -((char)bVar74 < (char)bStack_1a3);
      bVar98 = bVar97 | bVar98 | -bVar25 & bVar123 & -((char)bVar75 < (char)bStack_1a2);
      bVar100 = bVar99 | bVar100 | -bVar26 & bVar124 & -((char)bVar76 < (char)bStack_1a1);
      bVar102 = bVar101 | bVar102 | -bVar27 & bVar125 & -((char)bVar77 < (char)bStack_1a0);
      bVar104 = bVar103 | bVar104 | -bVar28 & bVar126 & -((char)bVar78 < (char)bStack_19f);
      bVar106 = bVar105 | bVar106 | -bVar29 & bVar127 & -((char)bVar79 < (char)bStack_19e);
      bVar108 = bVar107 | bVar108 | -bVar30 & bVar128 & -((char)bVar80 < (char)bStack_19d);
      bVar110 = bVar109 | bVar110 | -bVar31 & bVar129 & -((char)bVar81 < (char)bStack_19c);
      bVar112 = bVar111 | bVar112 | -bVar32 & bVar130 & -((char)bVar82 < (char)bStack_19b);
      bVar114 = bVar113 | bVar114 | -bVar33 & bVar131 & -((char)bVar83 < (char)bStack_19a);
      bVar116 = bVar115 | bVar116 | -bVar34 & bVar132 & -((char)bVar84 < (char)bStack_199);
      lVar44 = lVar44 + 0x10;
    }
    pbVar1 = __ptr + (long)pbVar47;
    *pbVar1 = bVar50 & -bVar3 | bVar86 | -bVar19 & bVar117;
    pbVar1[1] = bVar53 & -bVar4 | bVar88 | -bVar20 & bVar118;
    pbVar1[2] = bVar54 & -bVar5 | bVar90 | -bVar21 & bVar119;
    pbVar1[3] = bVar55 & -bVar6 | bVar92 | -bVar22 & bVar120;
    pbVar1[4] = bVar56 & -bVar7 | bVar94 | -bVar23 & bVar121;
    pbVar1[5] = bVar57 & -bVar8 | bVar96 | -bVar24 & bVar122;
    pbVar1[6] = bVar58 & -bVar9 | bVar98 | -bVar25 & bVar123;
    pbVar1[7] = bVar59 & -bVar10 | bVar100 | -bVar26 & bVar124;
    pbVar1[8] = bVar60 & -bVar11 | bVar102 | -bVar27 & bVar125;
    pbVar1[9] = bVar61 & -bVar12 | bVar104 | -bVar28 & bVar126;
    pbVar1[10] = bVar62 & -bVar13 | bVar106 | -bVar29 & bVar127;
    pbVar1[0xb] = bVar63 & -bVar14 | bVar108 | -bVar30 & bVar128;
    pbVar1[0xc] = bVar64 & -bVar15 | bVar110 | -bVar31 & bVar129;
    pbVar1[0xd] = bVar65 & -bVar16 | bVar112 | -bVar32 & bVar130;
    pbVar1[0xe] = bVar66 & -bVar17 | bVar114 | -bVar33 & bVar131;
    pbVar1[0xf] = bVar67 & -bVar18 | bVar116 | -bVar34 & bVar132;
    ppuVar49 = ppuVar49 + 0x10;
  }
  do {
    if (n <= pbVar45) {
      local_178 = 0;
      std::array<unsigned_long,_33UL>::fill(&bucketsize,&local_178);
      bVar37 = *__ptr;
      bucketsize._M_elems[bVar37] = bucketsize._M_elems[bVar37] + 1;
      uVar42 = (ulong)bVar37;
      for (uVar39 = 1;
          (uVar40 = n, n != uVar39 &&
          (bVar37 = __ptr[uVar39], uVar40 = uVar39, (byte)uVar42 <= bVar37)); uVar39 = uVar39 + 1) {
        bucketsize._M_elems[bVar37] = bucketsize._M_elems[bVar37] + 1;
        uVar42 = (ulong)bVar37;
      }
      for (; uVar40 < n; uVar40 = uVar40 + 1) {
        bucketsize._M_elems[__ptr[uVar40]] = bucketsize._M_elems[__ptr[uVar40]] + 1;
      }
      if (uVar39 < n) {
        __src = malloc(n * 8);
        multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[0] = 0;
        uVar43 = 0;
        for (lVar44 = 0; lVar44 != 0x20; lVar44 = lVar44 + 1) {
          uVar43 = uVar43 + bucketsize._M_elems[lVar44];
          multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[lVar44 + 1] = uVar43;
        }
        for (sVar41 = 0; n != sVar41; sVar41 = sVar41 + 1) {
          puVar2 = strings[sVar41];
          uVar43 = multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[__ptr[sVar41]];
          multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[__ptr[sVar41]] = uVar43 + 1;
          *(uchar **)((long)__src + uVar43 * 8) = puVar2;
        }
        memcpy(strings,__src,n * 8);
        free(__src);
      }
      free(__ptr);
      sVar41 = CONCAT71(bucketsize._M_elems[0]._1_7_,(byte)bucketsize._M_elems[0]);
      if (sVar41 != 0) {
        multikey_multipivot<unsigned_char,16u>(strings,sVar41,depth);
      }
      lVar44 = 0;
      do {
        if (lVar44 == 0xf) {
          if (bucketsize._M_elems[0x1f] != 0) {
            if (pivots._M_elems[0xf] != '\0') {
              multikey_multipivot<unsigned_char,16u>
                        (strings + sVar41,bucketsize._M_elems[0x1f],depth + 1);
            }
            sVar41 = sVar41 + bucketsize._M_elems[0x1f];
          }
          if (bucketsize._M_elems[0x20] != 0) {
            multikey_multipivot<unsigned_char,16u>(strings + sVar41,bucketsize._M_elems[0x20],depth)
            ;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&sample_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    );
          std::
          _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
          ::~_Rb_tree(&sample._M_t);
          return;
        }
        n_00 = bucketsize._M_elems[lVar44 * 2 + 1];
        if ((n_00 != 0) && (pivots._M_elems[lVar44] != '\0')) {
          multikey_multipivot<unsigned_char,16u>(strings + sVar41,n_00,depth + 1);
        }
        n_01 = bucketsize._M_elems[lVar44 * 2 + 2];
        if (n_01 != 0) {
          if (pivots._M_elems[lVar44] == pivots._M_elems[lVar44 + 1]) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                          ,0x50,"unsigned int lcp(unsigned char, unsigned char)");
          }
          multikey_multipivot<unsigned_char,16u>(strings + n_00 + sVar41,n_01,depth);
        }
        lVar44 = lVar44 + 1;
        sVar41 = n_01 + n_00 + sVar41;
      } while( true );
    }
    bVar37 = get_char<unsigned_char>(strings[(long)pbVar45],depth);
    if (bVar37 < pivots._M_elems[0]) {
      __ptr[(long)pbVar45] = 0;
    }
    else {
      bVar38 = 2;
      for (lVar44 = 1; lVar44 != 0x10; lVar44 = lVar44 + 1) {
        if (bVar37 == pivots._M_elems[lVar44 + -1]) {
          bVar38 = bVar38 - 1;
LAB_001fc001:
          __ptr[(long)pbVar45] = bVar38;
          goto LAB_001fc00c;
        }
        if ((pivots._M_elems[lVar44 + -1] < bVar37) && (bVar37 < pivots._M_elems[lVar44]))
        goto LAB_001fc001;
        bVar38 = bVar38 + 2;
      }
      if (bVar37 == pivots._M_elems[0xf]) {
        __ptr[(long)pbVar45] = 0x1f;
      }
      else {
        __ptr[(long)pbVar45] = 0x20;
      }
    }
LAB_001fc00c:
    pbVar45 = pbVar45 + 1;
  } while( true );
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}